

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.cc
# Opt level: O0

IdSet * __thiscall
IdSetLexicon::id_set(IdSet *__return_storage_ptr__,IdSetLexicon *this,int32 set_id)

{
  size_t sVar1;
  ostream *poVar2;
  reference begin;
  reference piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60 [3];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  undefined1 local_28 [8];
  Sequence sequence;
  int32 set_id_local;
  IdSetLexicon *this_local;
  
  sequence.end_._M_current._4_4_ = set_id;
  if (set_id < 0) {
    if (set_id == -0x80000000) {
      IdSet::IdSet(__return_storage_ptr__);
    }
    else {
      _local_28 = SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::sequence
                            (&this->id_sets_,set_id ^ 0xffffffff);
      sVar1 = SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::Sequence::size
                        ((Sequence *)local_28);
      local_41 = 0;
      if (sVar1 == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.cc"
                   ,0x4e,kFatal,(ostream *)&std::cerr);
        local_41 = 1;
        poVar2 = S2LogMessage::stream(&local_40);
        poVar2 = std::operator<<(poVar2,"Check failed: (0) != (sequence.size()) ");
        S2LogMessageVoidify::operator&(&local_29,poVar2);
      }
      if ((local_41 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
      }
      local_60[0]._M_current =
           (int *)SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::Sequence::begin
                            ((Sequence *)local_28);
      begin = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(local_60);
      local_68._M_current =
           (int *)SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::Sequence::begin
                            ((Sequence *)local_28);
      piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_68);
      sVar1 = SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::Sequence::size
                        ((Sequence *)local_28);
      IdSet::IdSet(__return_storage_ptr__,begin,piVar3 + sVar1);
    }
  }
  else {
    IdSet::IdSet(__return_storage_ptr__,set_id);
  }
  return __return_storage_ptr__;
}

Assistant:

IdSetLexicon::IdSet IdSetLexicon::id_set(int32 set_id) const {
  if (set_id >= 0) {
    return IdSet(set_id);
  } else if (set_id == kEmptySetId) {
    return IdSet();
  } else {
    auto sequence = id_sets_.sequence(~set_id);
    S2_DCHECK_NE(0, sequence.size());
    return IdSet(&*sequence.begin(), &*sequence.begin() + sequence.size());
  }
}